

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanystringview.h
# Opt level: O0

size_t QAnyStringView::encodeType<char>(char *str,qsizetype sz)

{
  bool bVar1;
  ulong in_RSI;
  char *in_RDI;
  
  bVar1 = isAsciiOnlyCharsAtCompileTime<char_const>(in_RDI,in_RSI);
  return in_RSI | (ulong)bVar1 << 0x3e;
}

Assistant:

static constexpr std::size_t encodeType(const Char *str, qsizetype sz) noexcept
    {
        // Utf16 if 16 bit, Latin1 if ASCII, else Utf8
        Q_ASSERT(sz >= 0);
        Q_ASSERT(sz <= qsizetype(SizeMask));
        Q_ASSERT(str || !sz);
        return (std::size_t(sz) << SizeShift)
                | uint(sizeof(Char) == sizeof(char16_t)) * Tag::Utf16
                | uint(isAsciiOnlyCharsAtCompileTime(str, sz)) * Tag::Latin1;
    }